

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O3

void __thiscall
TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_Test::
~TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_Test
          (TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeStrictGroupFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xsggroup" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}